

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O0

void write_vector_int<QPDF::HPageOffsetEntry,int>
               (BitWriter *w,int nitems,
               vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec,int bits
               ,offset_in_HPageOffsetEntry_to_int field)

{
  BitWriter *this;
  size_t sVar1;
  reference pvVar2;
  unsigned_long_long val;
  ulong local_38;
  size_t i;
  offset_in_HPageOffsetEntry_to_int field_local;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *pvStack_20;
  int bits_local;
  vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_> *vec_local;
  BitWriter *pBStack_10;
  int nitems_local;
  BitWriter *w_local;
  
  local_38 = 0;
  field_local._4_4_ = bits;
  pvStack_20 = vec;
  vec_local._4_4_ = nitems;
  pBStack_10 = w;
  while( true ) {
    sVar1 = QIntC::to_size<int>((int *)((long)&vec_local + 4));
    this = pBStack_10;
    if (sVar1 <= local_38) break;
    pvVar2 = std::vector<QPDF::HPageOffsetEntry,_std::allocator<QPDF::HPageOffsetEntry>_>::at
                       (pvStack_20,local_38);
    val = QIntC::to_ulonglong<int>((int *)((long)&pvVar2->delta_nobjects + field));
    sVar1 = QIntC::to_size<int>((int *)((long)&field_local + 4));
    BitWriter::writeBits(this,val,sVar1);
    local_38 = local_38 + 1;
  }
  BitWriter::flush(pBStack_10);
  return;
}

Assistant:

static void
write_vector_int(BitWriter& w, int nitems, std::vector<T>& vec, int bits, int_type T::* field)
{
    // nitems times, write bits bits from the given field of the ith vector to the given bit writer.

    for (size_t i = 0; i < QIntC::to_size(nitems); ++i) {
        w.writeBits(QIntC::to_ulonglong(vec.at(i).*field), QIntC::to_size(bits));
    }
    // The PDF spec says that each hint table starts at a byte boundary.  Each "row" actually must
    // start on a byte boundary.
    w.flush();
}